

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

lua_Integer intarith(lua_State *L,int op,lua_Integer v1,lua_Integer v2)

{
  lua_Integer lVar1;
  ulong uVar2;
  
  switch(op) {
  case 0:
    uVar2 = v2 + v1;
    break;
  case 1:
    return v1 - v2;
  case 2:
    uVar2 = v2 * v1;
    break;
  case 3:
    lVar1 = luaV_mod(L,v1,v2);
    return lVar1;
  default:
    return 0;
  case 6:
    lVar1 = luaV_div(L,v1,v2);
    return lVar1;
  case 7:
    uVar2 = v2 & v1;
    break;
  case 8:
    uVar2 = v2 | v1;
    break;
  case 9:
    uVar2 = v2 ^ v1;
    break;
  case 0xb:
    v2 = -v2;
  case 10:
    lVar1 = luaV_shiftl(v1,v2);
    return lVar1;
  case 0xc:
    return -v1;
  case 0xd:
    return ~v1;
  }
  return uVar2;
}

Assistant:

static lua_Integer intarith(lua_State *L, int op, lua_Integer v1,
                            lua_Integer v2) {
    switch (op) {
        case LUA_OPADD:
            return intop(+, v1, v2);
        case LUA_OPSUB:
            return intop(-, v1, v2);
        case LUA_OPMUL:
            return intop(*, v1, v2);
        case LUA_OPMOD:
            return luaV_mod(L, v1, v2);
        case LUA_OPIDIV:
            return luaV_div(L, v1, v2);
        case LUA_OPBAND:
            return intop(&, v1, v2);
        case LUA_OPBOR:
            return intop(|, v1, v2);
        case LUA_OPBXOR:
            return intop(^, v1, v2);
        case LUA_OPSHL:
            return luaV_shiftl(v1, v2);
        case LUA_OPSHR:
            return luaV_shiftl(v1, -v2);
        case LUA_OPUNM:
            return intop(-, 0, v1);
        case LUA_OPBNOT:
            return intop(^, ~l_castS2U(0), v1);
        default:
            lua_assert(0);
            return 0;
    }
}